

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O0

void __thiscall
Assimp::DXFImporter::Parse3DFace(DXFImporter *this,LineReader *reader,FileData *output)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  PolyLine *this_00;
  __shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  string *psVar5;
  Logger *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  size_type sVar6;
  aiVector3t<float> *local_b8;
  value_type_conflict local_98;
  uint local_94;
  uint local_90;
  uint i;
  uint cnt;
  bool b [4];
  aiColor4D clr;
  aiVector3D vip [4];
  PolyLine *line;
  shared_ptr<Assimp::DXF::PolyLine> local_30;
  FileData *local_20;
  FileData *output_local;
  LineReader *reader_local;
  DXFImporter *this_local;
  
  local_20 = output;
  output_local = (FileData *)reader;
  reader_local = (LineReader *)this;
  pvVar4 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&output->blocks);
  this_00 = (PolyLine *)operator_new(0xa8);
  DXF::PolyLine::PolyLine(this_00);
  std::shared_ptr<Assimp::DXF::PolyLine>::shared_ptr<Assimp::DXF::PolyLine,void>(&local_30,this_00);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ::push_back(&pvVar4->lines,&local_30);
  std::shared_ptr<Assimp::DXF::PolyLine>::~shared_ptr(&local_30);
  pvVar4 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                     (&local_20->blocks);
  this_01 = (__shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ::back(&pvVar4->lines);
  vip[3]._4_8_ = std::
                 __shared_ptr_access<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(this_01);
  local_b8 = (aiVector3t<float> *)&clr.b;
  do {
    aiVector3t<float>::aiVector3t(local_b8);
    local_b8 = local_b8 + 1;
  } while (local_b8 != (aiVector3t<float> *)&vip[3].y);
  cnt = (uint)AI_DXF_DEFAULT_COLOR.r;
  b = (bool  [4])AI_DXF_DEFAULT_COLOR.g;
  clr.r = AI_DXF_DEFAULT_COLOR.b;
  clr.g = AI_DXF_DEFAULT_COLOR.a;
  memset(&i,0,4);
  while ((bVar1 = DXF::LineReader::End((LineReader *)output_local), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (iVar2 = DXF::LineReader::GroupCode((LineReader *)output_local), iVar2 != 0))) {
    iVar2 = DXF::LineReader::GroupCode((LineReader *)output_local);
    switch(iVar2) {
    case 8:
      psVar5 = DXF::LineReader::Value_abi_cxx11_((LineReader *)output_local);
      std::__cxx11::string::operator=((string *)(vip[3]._4_8_ + 0x68),(string *)psVar5);
      break;
    case 10:
      clr.b = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._2_1_ = 1;
      break;
    case 0xb:
      vip[0].y = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._3_1_ = 1;
      break;
    case 0xc:
      vip[1].y = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._0_1_ = 1;
      break;
    case 0xd:
      vip[2].y = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._1_1_ = 1;
      break;
    case 0x14:
      clr.a = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._2_1_ = 1;
      break;
    case 0x15:
      vip[0].z = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._3_1_ = 1;
      break;
    case 0x16:
      vip[1].z = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._0_1_ = 1;
      break;
    case 0x17:
      vip[2].z = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._1_1_ = 1;
      break;
    case 0x1e:
      vip[0].x = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._2_1_ = 1;
      break;
    case 0x1f:
      vip[1].x = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._3_1_ = 1;
      break;
    case 0x20:
      vip[2].x = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._0_1_ = 1;
      break;
    case 0x21:
      vip[3].x = DXF::LineReader::ValueAsFloat((LineReader *)output_local);
      i._1_1_ = 1;
      break;
    case 0x3e:
      uVar3 = DXF::LineReader::ValueAsUnsignedInt((LineReader *)output_local);
      cnt = (uint)g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].r;
      b = (bool  [4])g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].g;
      clr.r = g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].b;
      clr.g = g_aclrDxfIndexColors[(ulong)uVar3 & 0xf].a;
    }
    DXF::LineReader::operator++((LineReader *)output_local);
  }
  bVar1 = aiVector3t<float>::operator==
                    ((aiVector3t<float> *)&vip[2].y,(aiVector3t<float> *)&vip[1].y);
  if (bVar1) {
    i._1_1_ = 0;
  }
  if (((((i._1_1_ & 1) == 0) || (((byte)i & 1) != 0)) && ((i._2_1_ & 1) != 0)) &&
     ((i._3_1_ & 1) != 0)) {
    local_90 = (((byte)i & 1) != 0) + 2 + (uint)((i._1_1_ & 1) != 0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(vip[3]._4_8_ + 0x48),
               &local_90);
    for (local_94 = 0; local_94 < local_90; local_94 = local_94 + 1) {
      this_03 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(vip[3]._4_8_ + 0x30);
      sVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         vip[3]._4_8_);
      local_98 = (value_type_conflict)sVar6;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_03,&local_98);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)vip[3]._4_8_,
                 (value_type *)&vip[(ulong)local_94 - 1].y);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                 (vip[3]._4_8_ + 0x18),(value_type *)&cnt);
    }
  }
  else {
    this_02 = DefaultLogger::get();
    Logger::warn(this_02,"DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
    pvVar4 = std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::back
                       (&local_20->blocks);
    std::
    vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
    ::pop_back(&pvVar4->lines);
  }
  return;
}

Assistant:

void DXFImporter::Parse3DFace(DXF::LineReader& reader, DXF::FileData& output)
{
    // (note) this is also used for for parsing line entities, so we
    // must handle the vertex_count == 2 case as well.

    output.blocks.back().lines.push_back( std::shared_ptr<DXF::PolyLine>( new DXF::PolyLine() )  );
    DXF::PolyLine& line = *output.blocks.back().lines.back();

    aiVector3D vip[4];
    aiColor4D  clr = AI_DXF_DEFAULT_COLOR;

    bool b[4] = {false,false,false,false};
    while( !reader.End() ) {

        // next entity with a groupcode == 0 is probably already the next vertex or polymesh entity
        if (reader.GroupCode() == 0) {
            break;
        }
        switch (reader.GroupCode())
        {

        // 8 specifies the layer
        case 8:
            line.layer = reader.Value();
            break;

        // x position of the first corner
        case 10:
            vip[0].x = reader.ValueAsFloat();
            b[2] = true;
            break;

        // y position of the first corner
        case 20:
            vip[0].y = reader.ValueAsFloat();
            b[2] = true;
            break;

        // z position of the first corner
        case 30:
            vip[0].z = reader.ValueAsFloat();
            b[2] = true;
            break;

        // x position of the second corner
        case 11:
            vip[1].x = reader.ValueAsFloat();
            b[3] = true;
            break;

        // y position of the second corner
        case 21:
            vip[1].y = reader.ValueAsFloat();
            b[3] = true;
            break;

        // z position of the second corner
        case 31:
            vip[1].z = reader.ValueAsFloat();
            b[3] = true;
            break;

        // x position of the third corner
        case 12:
            vip[2].x = reader.ValueAsFloat();
            b[0] = true;
            break;

        // y position of the third corner
        case 22:
            vip[2].y = reader.ValueAsFloat();
            b[0] = true;
            break;

        // z position of the third corner
        case 32:
            vip[2].z = reader.ValueAsFloat();
            b[0] = true;
            break;

        // x position of the fourth corner
        case 13:
            vip[3].x = reader.ValueAsFloat();
            b[1] = true;
            break;

        // y position of the fourth corner
        case 23:
            vip[3].y = reader.ValueAsFloat();
            b[1] = true;
            break;

        // z position of the fourth corner
        case 33:
            vip[3].z = reader.ValueAsFloat();
            b[1] = true;
            break;

        // color
        case 62:
            clr = g_aclrDxfIndexColors[reader.ValueAsUnsignedInt() % AI_DXF_NUM_INDEX_COLORS];
            break;
        };

        ++reader;
    }

    // the fourth corner may even be identical to the third,
    // in this case we treat it as if it didn't exist.
    if (vip[3] == vip[2]) {
        b[1] = false;
    }

    // sanity checks to see if we got something meaningful
    if ((b[1] && !b[0]) || !b[2] || !b[3]) {
        ASSIMP_LOG_WARN("DXF: unexpected vertex setup in 3DFACE/LINE/FACE entity; ignoring");
        output.blocks.back().lines.pop_back();
        return;
    }

    const unsigned int cnt = (2+(b[0]?1:0)+(b[1]?1:0));
    line.counts.push_back(cnt);

    for (unsigned int i = 0; i < cnt; ++i) {
        line.indices.push_back(static_cast<unsigned int>(line.positions.size()));
        line.positions.push_back(vip[i]);
        line.colors.push_back(clr);
    }
}